

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

uint * If_CluHashLookup(If_Man_t *p,word *pTruth,int t)

{
  If_Hte_t *pIVar1;
  long lVar2;
  int nWords_00;
  int iVar3;
  uint uVar4;
  Mem_Fixed_t *pMVar5;
  void **ppvVar6;
  Vec_Ptr_t *p_00;
  long *plVar7;
  char *pcVar8;
  bool bVar9;
  int local_5c;
  int Median;
  int i;
  Vec_Ptr_t *vUseful;
  If_Hte_t *pPrev_1;
  int nEntriesMax2;
  int nEntriesMax1;
  int HashKey;
  int nWords;
  If_Hte_t *pPrev;
  If_Hte_t *pEntry;
  int t_local;
  word *pTruth_local;
  If_Man_t *p_local;
  
  if (p == (If_Man_t *)0x0) {
    p_local = (If_Man_t *)0x0;
  }
  else {
    nWords_00 = If_CluWordNum(p->pPars->nLutSize);
    if (p->pMemEntries == (Mem_Fixed_t *)0x0) {
      iVar3 = If_CluWordNum(p->pPars->nLutSize);
      pMVar5 = Mem_FixedStart((iVar3 + -1) * 8 + 0x18);
      p->pMemEntries = pMVar5;
    }
    if (p->pHashTable[t] == (void **)0x0) {
      iVar3 = Vec_PtrSize(p->vObjs);
      uVar4 = If_CluPrimeCudd(iVar3 * p->pPars->nCutsMax);
      iVar3 = If_CluWordNum(p->pPars->nLutSize);
      iVar3 = Abc_MinInt(uVar4 << 2,(int)((1048576000.0 / (double)iVar3) / 8.0));
      uVar4 = If_CluPrimeCudd(iVar3 / 2);
      p->nTableSize[t] = uVar4;
      ppvVar6 = (void **)calloc((long)p->nTableSize[t],8);
      p->pHashTable[t] = ppvVar6;
    }
    nEntriesMax2 = If_CluHashKey(pTruth,nWords_00,p->nTableSize[t]);
    for (pPrev = (If_Hte_t *)p->pHashTable[t][nEntriesMax2]; pPrev != (If_Hte_t *)0x0;
        pPrev = pPrev->pNext) {
      iVar3 = memcmp(pPrev->pTruth,pTruth,(long)nWords_00 << 3);
      if (iVar3 == 0) {
        pPrev->Counter = pPrev->Counter + 1;
        return &pPrev->Group;
      }
    }
    if (SBORROW4(p->nTableEntries[t],p->nTableSize[t] * 2) ==
        p->nTableEntries[t] + p->nTableSize[t] * -2 < 0) {
      p_00 = Vec_PtrAlloc(p->nTableEntries[t]);
      iVar3 = If_CluHashFindMedian(p,t);
      for (local_5c = 0; local_5c < p->nTableSize[t]; local_5c = local_5c + 1) {
        pPrev = (If_Hte_t *)p->pHashTable[t][local_5c];
        while (pPrev != (If_Hte_t *)0x0) {
          if (iVar3 < (int)pPrev->Counter) {
            Vec_PtrPush(p_00,pPrev);
            pPrev = pPrev->pNext;
          }
          else {
            pIVar1 = pPrev->pNext;
            Mem_FixedEntryRecycle(p->pMemEntries,(char *)pPrev);
            pPrev = pIVar1;
          }
        }
      }
      memset(p->pHashTable[t],0,(long)p->nTableSize[t] << 3);
      for (local_5c = 0; iVar3 = Vec_PtrSize(p_00), local_5c < iVar3; local_5c = local_5c + 1) {
        plVar7 = (long *)Vec_PtrEntry(p_00,local_5c);
        nEntriesMax2 = If_CluHashKey((word *)(plVar7 + 2),nWords_00,p->nTableSize[t]);
        vUseful = (Vec_Ptr_t *)p->pHashTable[t][nEntriesMax2];
        if ((vUseful == (Vec_Ptr_t *)0x0) ||
           (*(uint *)((long)&vUseful->pArray + 4) <= *(uint *)((long)plVar7 + 0xc))) {
          *plVar7 = (long)vUseful;
          p->pHashTable[t][nEntriesMax2] = plVar7;
        }
        else {
          while( true ) {
            lVar2._0_4_ = vUseful->nCap;
            lVar2._4_4_ = vUseful->nSize;
            bVar9 = false;
            if (lVar2 != 0) {
              bVar9 = *(uint *)((long)plVar7 + 0xc) < *(uint *)(*(long *)vUseful + 0xc);
            }
            if (!bVar9) break;
            vUseful = *(Vec_Ptr_t **)vUseful;
          }
          *plVar7 = *(long *)vUseful;
          *(long **)vUseful = plVar7;
        }
      }
      iVar3 = Vec_PtrSize(p_00);
      p->nTableEntries[t] = iVar3;
      Vec_PtrFree(p_00);
    }
    p->nTableEntries[t] = p->nTableEntries[t] + 1;
    pcVar8 = Mem_FixedEntryFetch(p->pMemEntries);
    memcpy(pcVar8 + 0x10,pTruth,(long)nWords_00 << 3);
    pcVar8[8] = -1;
    pcVar8[9] = '\0';
    pcVar8[10] = '\0';
    pcVar8[0xb] = '\0';
    pcVar8[0xc] = '\x01';
    pcVar8[0xd] = '\0';
    pcVar8[0xe] = '\0';
    pcVar8[0xf] = '\0';
    pcVar8[0] = '\0';
    pcVar8[1] = '\0';
    pcVar8[2] = '\0';
    pcVar8[3] = '\0';
    pcVar8[4] = '\0';
    pcVar8[5] = '\0';
    pcVar8[6] = '\0';
    pcVar8[7] = '\0';
    _HashKey = (long *)p->pHashTable[t][nEntriesMax2];
    while( true ) {
      bVar9 = false;
      if (_HashKey != (long *)0x0) {
        bVar9 = *_HashKey != 0;
      }
      if (!bVar9) break;
      _HashKey = (long *)*_HashKey;
    }
    if (_HashKey == (long *)0x0) {
      p->pHashTable[t][nEntriesMax2] = pcVar8;
    }
    else {
      *_HashKey = (long)pcVar8;
    }
    p_local = (If_Man_t *)(pcVar8 + 8);
  }
  return (uint *)p_local;
}

Assistant:

unsigned * If_CluHashLookup( If_Man_t * p, word * pTruth, int t )
{
    If_Hte_t * pEntry, * pPrev;
    int nWords, HashKey;
    if ( p == NULL )
        return NULL;
    nWords = If_CluWordNum(p->pPars->nLutSize);
    if ( p->pMemEntries == NULL )
        p->pMemEntries = Mem_FixedStart( sizeof(If_Hte_t) + sizeof(word) * (If_CluWordNum(p->pPars->nLutSize) - 1) );
    if ( p->pHashTable[t] == NULL )
    {
        // decide how large should be the table
        int nEntriesMax1 = 4 * If_CluPrimeCudd( Vec_PtrSize(p->vObjs) * p->pPars->nCutsMax );
        int nEntriesMax2 = (int)(((double)CLU_MEM_MAX * (1 << 20)) / If_CluWordNum(p->pPars->nLutSize) / 8);
//        int nEntriesMax2 = 10000;
        // create table
        p->nTableSize[t] = If_CluPrimeCudd( Abc_MinInt(nEntriesMax1, nEntriesMax2)/2 );
        p->pHashTable[t] = ABC_CALLOC( void *, p->nTableSize[t] );
    }
    // check if this entry exists
    HashKey = If_CluHashKey( pTruth, nWords, p->nTableSize[t] );
    for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[HashKey]; pEntry; pEntry = pEntry->pNext )
        if ( memcmp(pEntry->pTruth, pTruth, sizeof(word) * nWords) == 0 )
        {
            pEntry->Counter++;
            return &pEntry->Group;
        }
    // resize the hash table
    if ( p->nTableEntries[t] >= 2 * p->nTableSize[t] )
    {
        // collect useful entries
        If_Hte_t * pPrev;
        Vec_Ptr_t * vUseful = Vec_PtrAlloc( p->nTableEntries[t] );
        int i, Median = If_CluHashFindMedian( p, t );
        for ( i = 0; i < p->nTableSize[t]; i++ )
        {
            for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; )
            {
                if ( (int)pEntry->Counter > Median )
                {
                    Vec_PtrPush( vUseful, pEntry );
                    pEntry = pEntry->pNext;
                }
                else
                {
                    pPrev = pEntry->pNext;
                    Mem_FixedEntryRecycle( p->pMemEntries, (char *)pEntry );
                    pEntry = pPrev;
                }
            }
        }
        // add useful entries
        memset( p->pHashTable[t], 0, sizeof(void *) * p->nTableSize[t] );
        Vec_PtrForEachEntry( If_Hte_t *, vUseful, pEntry, i )
        {
            HashKey = If_CluHashKey( pEntry->pTruth, nWords, p->nTableSize[t] );
            pPrev = ((If_Hte_t **)p->pHashTable[t])[HashKey];
            if ( pPrev == NULL || pEntry->Counter >= pPrev->Counter )
            {
                pEntry->pNext = pPrev;
                ((If_Hte_t **)p->pHashTable[t])[HashKey] = pEntry;
            }
            else
            {
                while ( pPrev->pNext && pEntry->Counter < pPrev->pNext->Counter )
                    pPrev = pPrev->pNext;
                pEntry->pNext = pPrev->pNext;
                pPrev->pNext = pEntry;
            }
        }
        p->nTableEntries[t] = Vec_PtrSize( vUseful );
        Vec_PtrFree( vUseful );
    }
    // create entry
    p->nTableEntries[t]++;
    pEntry = (If_Hte_t *)Mem_FixedEntryFetch( p->pMemEntries );
    memcpy( pEntry->pTruth, pTruth, sizeof(word) * nWords );
    pEntry->Group = CLU_UNUSED;
    pEntry->Counter = 1;
    // insert at the beginning
//    pEntry->pNext = ((If_Hte_t **)p->pHashTable[t])[HashKey];
//    ((If_Hte_t **)p->pHashTable[t])[HashKey] = pEntry;
    // insert at the end
    pEntry->pNext = NULL;
    for ( pPrev = ((If_Hte_t **)p->pHashTable[t])[HashKey]; pPrev && pPrev->pNext; pPrev = pPrev->pNext );
    if ( pPrev == NULL )
        ((If_Hte_t **)p->pHashTable[t])[HashKey] = pEntry;
    else
        pPrev->pNext = pEntry;
    return &pEntry->Group;
}